

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m256v_U_mult_inplace(m256v *LU,m256v *X_inout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (0 < LU->n_col) {
    lVar4 = 1;
    lVar1 = 0;
    do {
      if (LU->n_row <= lVar1) {
        return;
      }
      m256v_mult_row(X_inout,(int)lVar1,LU->e[lVar1 + LU->rstride * lVar1]);
      lVar2 = lVar1 + 1;
      lVar3 = lVar4;
      if (lVar2 < LU->n_col) {
        do {
          m256v_multadd_row_from
                    (X_inout,(int)lVar3,0,LU->e[lVar3 + LU->rstride * lVar1],X_inout,(int)lVar1);
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < LU->n_col);
      }
      lVar4 = lVar4 + 1;
      lVar1 = lVar2;
    } while (lVar2 < LU->n_col);
  }
  return;
}

Assistant:

void MV_GEN_N(_U_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = 0; i < LU->n_col && i < LU->n_row; ++i) {
		MV_GEN_N(_mult_row)(X_inout, i, MV_GEN_N(_get_el)(LU, i, i));
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_inout, j,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, i);
		}
	}
}